

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void CoreML::Specification::MILSpec::protobuf_MIL_2eproto::TableStruct::InitDefaultsImpl(void)

{
  MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  *pMVar1;
  MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  *default_instance;
  MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  *pMVar2;
  MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  *pMVar3;
  MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  *pMVar4;
  MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  *default_instance_00;
  MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  *pMVar5;
  MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  *default_instance_01;
  ValueType *pVVar6;
  NamedValueType *pNVar7;
  ListType *pLVar8;
  Dimension *pDVar9;
  DictionaryType *pDVar10;
  Value *pVVar11;
  DictionaryValue_KeyValuePair *pDVar12;
  
  google::protobuf::internal::VerifyVersion
            (0x2dd278,0x2dd278,
             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O0/mlmodel/format/MIL.pb.cc"
            );
  google::protobuf::internal::InitProtobufDefaults();
  google::protobuf::internal::
  ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
  ::DefaultConstruct((ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
                      *)_Program_FunctionsEntry_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
  ::DefaultConstruct((ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
                      *)_Program_AttributesEntry_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::MILSpec::Program>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::MILSpec::Program> *)
                   _Program_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
  ::DefaultConstruct((ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
                      *)_Function_BlockSpecializationsEntry_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
  ::DefaultConstruct((ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
                      *)_Function_AttributesEntry_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::MILSpec::Function>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::MILSpec::Function> *)
                   _Function_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
  ::DefaultConstruct((ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
                      *)_Block_AttributesEntry_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::MILSpec::Block>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::MILSpec::Block> *)
                   _Block_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::MILSpec::Argument_Binding>::DefaultConstruct
            ((ExplicitlyConstructed<CoreML::Specification::MILSpec::Argument_Binding> *)
             _Argument_Binding_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::MILSpec::Argument>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::MILSpec::Argument> *)
                   _Argument_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
  ::DefaultConstruct((ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
                      *)_Operation_InputsEntry_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
  ::DefaultConstruct((ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
                      *)_Operation_AttributesEntry_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::MILSpec::Operation>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::MILSpec::Operation> *)
                   _Operation_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::MILSpec::NamedValueType>
  ::DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::MILSpec::NamedValueType> *)
                     _NamedValueType_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::MILSpec::ValueType>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::MILSpec::ValueType> *)
                   _ValueType_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
  ::DefaultConstruct((ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
                      *)_TensorType_AttributesEntry_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::MILSpec::TensorType>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::MILSpec::TensorType> *)
                   _TensorType_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::MILSpec::TupleType>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::MILSpec::TupleType> *)
                   _TupleType_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::MILSpec::ListType>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::MILSpec::ListType> *)
                   _ListType_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::MILSpec::DictionaryType>
  ::DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::MILSpec::DictionaryType> *)
                     _DictionaryType_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::MILSpec::Dimension_ConstantDimension>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::MILSpec::Dimension_ConstantDimension>
                    *)_Dimension_ConstantDimension_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::MILSpec::Dimension_UnknownDimension>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::MILSpec::Dimension_UnknownDimension>
                    *)_Dimension_UnknownDimension_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::MILSpec::Dimension>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::MILSpec::Dimension> *)
                   _Dimension_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::MILSpec::Value_ImmediateValue>::DefaultConstruct
            ((ExplicitlyConstructed<CoreML::Specification::MILSpec::Value_ImmediateValue> *)
             _Value_ImmediateValue_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::MILSpec::Value_BlobFileValue>::DefaultConstruct
            ((ExplicitlyConstructed<CoreML::Specification::MILSpec::Value_BlobFileValue> *)
             _Value_BlobFileValue_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::MILSpec::Value>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::MILSpec::Value> *)
                   _Value_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::MILSpec::TensorValue_RepeatedFloats>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::MILSpec::TensorValue_RepeatedFloats>
                    *)_TensorValue_RepeatedFloats_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::MILSpec::TensorValue_RepeatedDoubles>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::MILSpec::TensorValue_RepeatedDoubles>
                    *)_TensorValue_RepeatedDoubles_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::MILSpec::TensorValue_RepeatedInts>::DefaultConstruct
            ((ExplicitlyConstructed<CoreML::Specification::MILSpec::TensorValue_RepeatedInts> *)
             _TensorValue_RepeatedInts_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::MILSpec::TensorValue_RepeatedLongInts>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::MILSpec::TensorValue_RepeatedLongInts>
                    *)_TensorValue_RepeatedLongInts_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::MILSpec::TensorValue_RepeatedBools>::DefaultConstruct
            ((ExplicitlyConstructed<CoreML::Specification::MILSpec::TensorValue_RepeatedBools> *)
             _TensorValue_RepeatedBools_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::MILSpec::TensorValue_RepeatedStrings>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::MILSpec::TensorValue_RepeatedStrings>
                    *)_TensorValue_RepeatedStrings_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::MILSpec::TensorValue_RepeatedBytes>::DefaultConstruct
            ((ExplicitlyConstructed<CoreML::Specification::MILSpec::TensorValue_RepeatedBytes> *)
             _TensorValue_RepeatedBytes_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::MILSpec::TensorValue>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::MILSpec::TensorValue> *)
                   _TensorValue_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::MILSpec::TupleValue>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::MILSpec::TupleValue> *)
                   _TupleValue_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::MILSpec::ListValue>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::MILSpec::ListValue> *)
                   _ListValue_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::MILSpec::DictionaryValue_KeyValuePair>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::MILSpec::DictionaryValue_KeyValuePair>
                    *)_DictionaryValue_KeyValuePair_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::MILSpec::DictionaryValue>
  ::DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::MILSpec::DictionaryValue> *)
                     _DictionaryValue_default_instance_);
  pMVar1 = &google::protobuf::internal::
            ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
            ::get_mutable((ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
                           *)_Program_FunctionsEntry_default_instance_)->
            super_MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  ;
  default_instance =
       &google::protobuf::internal::
        ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
        ::get_mutable((ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
                       *)_Program_FunctionsEntry_default_instance_)->
        super_MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  ;
  google::protobuf::internal::
  MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  ::set_default_instance(pMVar1,default_instance);
  pMVar1 = &google::protobuf::internal::
            ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
            ::get_mutable((ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
                           *)_Program_FunctionsEntry_default_instance_)->
            super_MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  ;
  google::protobuf::internal::
  MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  ::InitAsDefaultInstance(pMVar1);
  pMVar2 = &google::protobuf::internal::
            ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
            ::get_mutable((ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
                           *)_Program_AttributesEntry_default_instance_)->
            super_MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  ;
  pMVar3 = &google::protobuf::internal::
            ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
            ::get_mutable((ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
                           *)_Program_AttributesEntry_default_instance_)->
            super_MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  ;
  google::protobuf::internal::
  MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  ::set_default_instance(pMVar2,pMVar3);
  pMVar2 = &google::protobuf::internal::
            ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
            ::get_mutable((ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
                           *)_Program_AttributesEntry_default_instance_)->
            super_MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  ;
  google::protobuf::internal::
  MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  ::InitAsDefaultInstance(pMVar2);
  pMVar4 = &google::protobuf::internal::
            ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
            ::get_mutable((ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
                           *)_Function_BlockSpecializationsEntry_default_instance_)->
            super_MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  ;
  default_instance_00 =
       &google::protobuf::internal::
        ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
        ::get_mutable((ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
                       *)_Function_BlockSpecializationsEntry_default_instance_)->
        super_MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  ;
  google::protobuf::internal::
  MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  ::set_default_instance(pMVar4,default_instance_00);
  pMVar4 = &google::protobuf::internal::
            ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
            ::get_mutable((ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
                           *)_Function_BlockSpecializationsEntry_default_instance_)->
            super_MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  ;
  google::protobuf::internal::
  MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Block,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  ::InitAsDefaultInstance(pMVar4);
  pMVar2 = &google::protobuf::internal::
            ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
            ::get_mutable((ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
                           *)_Function_AttributesEntry_default_instance_)->
            super_MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  ;
  pMVar3 = &google::protobuf::internal::
            ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
            ::get_mutable((ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
                           *)_Function_AttributesEntry_default_instance_)->
            super_MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  ;
  google::protobuf::internal::
  MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  ::set_default_instance(pMVar2,pMVar3);
  pMVar2 = &google::protobuf::internal::
            ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
            ::get_mutable((ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
                           *)_Function_AttributesEntry_default_instance_)->
            super_MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  ;
  google::protobuf::internal::
  MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  ::InitAsDefaultInstance(pMVar2);
  pMVar2 = &google::protobuf::internal::
            ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
            ::get_mutable((ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
                           *)_Block_AttributesEntry_default_instance_)->
            super_MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  ;
  pMVar3 = &google::protobuf::internal::
            ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
            ::get_mutable((ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
                           *)_Block_AttributesEntry_default_instance_)->
            super_MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  ;
  google::protobuf::internal::
  MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  ::set_default_instance(pMVar2,pMVar3);
  pMVar2 = &google::protobuf::internal::
            ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
            ::get_mutable((ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
                           *)_Block_AttributesEntry_default_instance_)->
            super_MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  ;
  google::protobuf::internal::
  MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  ::InitAsDefaultInstance(pMVar2);
  pMVar5 = &google::protobuf::internal::
            ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
            ::get_mutable((ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
                           *)_Operation_InputsEntry_default_instance_)->
            super_MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  ;
  default_instance_01 =
       &google::protobuf::internal::
        ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
        ::get_mutable((ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
                       *)_Operation_InputsEntry_default_instance_)->
        super_MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  ;
  google::protobuf::internal::
  MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  ::set_default_instance(pMVar5,default_instance_01);
  pMVar5 = &google::protobuf::internal::
            ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
            ::get_mutable((ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
                           *)_Operation_InputsEntry_default_instance_)->
            super_MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  ;
  google::protobuf::internal::
  MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  ::InitAsDefaultInstance(pMVar5);
  pMVar2 = &google::protobuf::internal::
            ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
            ::get_mutable((ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
                           *)_Operation_AttributesEntry_default_instance_)->
            super_MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  ;
  pMVar3 = &google::protobuf::internal::
            ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
            ::get_mutable((ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
                           *)_Operation_AttributesEntry_default_instance_)->
            super_MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  ;
  google::protobuf::internal::
  MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  ::set_default_instance(pMVar2,pMVar3);
  pMVar2 = &google::protobuf::internal::
            ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
            ::get_mutable((ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
                           *)_Operation_AttributesEntry_default_instance_)->
            super_MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  ;
  google::protobuf::internal::
  MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  ::InitAsDefaultInstance(pMVar2);
  pVVar6 = ValueType::internal_default_instance();
  pNVar7 = google::protobuf::internal::
           ExplicitlyConstructed<CoreML::Specification::MILSpec::NamedValueType>::get_mutable
                     ((ExplicitlyConstructed<CoreML::Specification::MILSpec::NamedValueType> *)
                      _NamedValueType_default_instance_);
  pNVar7->type_ = pVVar6;
  pMVar2 = &google::protobuf::internal::
            ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
            ::get_mutable((ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
                           *)_TensorType_AttributesEntry_default_instance_)->
            super_MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  ;
  pMVar3 = &google::protobuf::internal::
            ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
            ::get_mutable((ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
                           *)_TensorType_AttributesEntry_default_instance_)->
            super_MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  ;
  google::protobuf::internal::
  MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  ::set_default_instance(pMVar2,pMVar3);
  pMVar2 = &google::protobuf::internal::
            ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
            ::get_mutable((ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>_>
                           *)_TensorType_AttributesEntry_default_instance_)->
            super_MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  ;
  google::protobuf::internal::
  MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  ::InitAsDefaultInstance(pMVar2);
  pVVar6 = ValueType::internal_default_instance();
  pLVar8 = google::protobuf::internal::
           ExplicitlyConstructed<CoreML::Specification::MILSpec::ListType>::get_mutable
                     ((ExplicitlyConstructed<CoreML::Specification::MILSpec::ListType> *)
                      _ListType_default_instance_);
  pLVar8->type_ = pVVar6;
  pDVar9 = Dimension::internal_default_instance();
  pLVar8 = google::protobuf::internal::
           ExplicitlyConstructed<CoreML::Specification::MILSpec::ListType>::get_mutable
                     ((ExplicitlyConstructed<CoreML::Specification::MILSpec::ListType> *)
                      _ListType_default_instance_);
  pLVar8->length_ = pDVar9;
  pVVar6 = ValueType::internal_default_instance();
  pDVar10 = google::protobuf::internal::
            ExplicitlyConstructed<CoreML::Specification::MILSpec::DictionaryType>::get_mutable
                      ((ExplicitlyConstructed<CoreML::Specification::MILSpec::DictionaryType> *)
                       _DictionaryType_default_instance_);
  pDVar10->keytype_ = pVVar6;
  pVVar6 = ValueType::internal_default_instance();
  pDVar10 = google::protobuf::internal::
            ExplicitlyConstructed<CoreML::Specification::MILSpec::DictionaryType>::get_mutable
                      ((ExplicitlyConstructed<CoreML::Specification::MILSpec::DictionaryType> *)
                       _DictionaryType_default_instance_);
  pDVar10->valuetype_ = pVVar6;
  pVVar6 = ValueType::internal_default_instance();
  pVVar11 = google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::MILSpec::Value>
            ::get_mutable((ExplicitlyConstructed<CoreML::Specification::MILSpec::Value> *)
                          _Value_default_instance_);
  pVVar11->type_ = pVVar6;
  pVVar11 = Value::internal_default_instance();
  pDVar12 = google::protobuf::internal::
            ExplicitlyConstructed<CoreML::Specification::MILSpec::DictionaryValue_KeyValuePair>::
            get_mutable((ExplicitlyConstructed<CoreML::Specification::MILSpec::DictionaryValue_KeyValuePair>
                         *)_DictionaryValue_KeyValuePair_default_instance_);
  pDVar12->key_ = pVVar11;
  pVVar11 = Value::internal_default_instance();
  pDVar12 = google::protobuf::internal::
            ExplicitlyConstructed<CoreML::Specification::MILSpec::DictionaryValue_KeyValuePair>::
            get_mutable((ExplicitlyConstructed<CoreML::Specification::MILSpec::DictionaryValue_KeyValuePair>
                         *)_DictionaryValue_KeyValuePair_default_instance_);
  pDVar12->value_ = pVVar11;
  return;
}

Assistant:

void TableStruct::InitDefaultsImpl() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  ::google::protobuf::internal::InitProtobufDefaults();
  _Program_FunctionsEntry_default_instance_.DefaultConstruct();
  _Program_AttributesEntry_default_instance_.DefaultConstruct();
  _Program_default_instance_.DefaultConstruct();
  _Function_BlockSpecializationsEntry_default_instance_.DefaultConstruct();
  _Function_AttributesEntry_default_instance_.DefaultConstruct();
  _Function_default_instance_.DefaultConstruct();
  _Block_AttributesEntry_default_instance_.DefaultConstruct();
  _Block_default_instance_.DefaultConstruct();
  _Argument_Binding_default_instance_.DefaultConstruct();
  _Argument_default_instance_.DefaultConstruct();
  _Operation_InputsEntry_default_instance_.DefaultConstruct();
  _Operation_AttributesEntry_default_instance_.DefaultConstruct();
  _Operation_default_instance_.DefaultConstruct();
  _NamedValueType_default_instance_.DefaultConstruct();
  _ValueType_default_instance_.DefaultConstruct();
  _TensorType_AttributesEntry_default_instance_.DefaultConstruct();
  _TensorType_default_instance_.DefaultConstruct();
  _TupleType_default_instance_.DefaultConstruct();
  _ListType_default_instance_.DefaultConstruct();
  _DictionaryType_default_instance_.DefaultConstruct();
  _Dimension_ConstantDimension_default_instance_.DefaultConstruct();
  _Dimension_UnknownDimension_default_instance_.DefaultConstruct();
  _Dimension_default_instance_.DefaultConstruct();
  _Value_ImmediateValue_default_instance_.DefaultConstruct();
  _Value_BlobFileValue_default_instance_.DefaultConstruct();
  _Value_default_instance_.DefaultConstruct();
  _TensorValue_RepeatedFloats_default_instance_.DefaultConstruct();
  _TensorValue_RepeatedDoubles_default_instance_.DefaultConstruct();
  _TensorValue_RepeatedInts_default_instance_.DefaultConstruct();
  _TensorValue_RepeatedLongInts_default_instance_.DefaultConstruct();
  _TensorValue_RepeatedBools_default_instance_.DefaultConstruct();
  _TensorValue_RepeatedStrings_default_instance_.DefaultConstruct();
  _TensorValue_RepeatedBytes_default_instance_.DefaultConstruct();
  _TensorValue_default_instance_.DefaultConstruct();
  _TupleValue_default_instance_.DefaultConstruct();
  _ListValue_default_instance_.DefaultConstruct();
  _DictionaryValue_KeyValuePair_default_instance_.DefaultConstruct();
  _DictionaryValue_default_instance_.DefaultConstruct();
  _Program_FunctionsEntry_default_instance_.get_mutable()->set_default_instance(_Program_FunctionsEntry_default_instance_.get_mutable());
  _Program_FunctionsEntry_default_instance_.get_mutable()->InitAsDefaultInstance();
  _Program_AttributesEntry_default_instance_.get_mutable()->set_default_instance(_Program_AttributesEntry_default_instance_.get_mutable());
  _Program_AttributesEntry_default_instance_.get_mutable()->InitAsDefaultInstance();
  _Function_BlockSpecializationsEntry_default_instance_.get_mutable()->set_default_instance(_Function_BlockSpecializationsEntry_default_instance_.get_mutable());
  _Function_BlockSpecializationsEntry_default_instance_.get_mutable()->InitAsDefaultInstance();
  _Function_AttributesEntry_default_instance_.get_mutable()->set_default_instance(_Function_AttributesEntry_default_instance_.get_mutable());
  _Function_AttributesEntry_default_instance_.get_mutable()->InitAsDefaultInstance();
  _Block_AttributesEntry_default_instance_.get_mutable()->set_default_instance(_Block_AttributesEntry_default_instance_.get_mutable());
  _Block_AttributesEntry_default_instance_.get_mutable()->InitAsDefaultInstance();
  _Operation_InputsEntry_default_instance_.get_mutable()->set_default_instance(_Operation_InputsEntry_default_instance_.get_mutable());
  _Operation_InputsEntry_default_instance_.get_mutable()->InitAsDefaultInstance();
  _Operation_AttributesEntry_default_instance_.get_mutable()->set_default_instance(_Operation_AttributesEntry_default_instance_.get_mutable());
  _Operation_AttributesEntry_default_instance_.get_mutable()->InitAsDefaultInstance();
  _NamedValueType_default_instance_.get_mutable()->type_ = const_cast< ::CoreML::Specification::MILSpec::ValueType*>(
      ::CoreML::Specification::MILSpec::ValueType::internal_default_instance());
  _TensorType_AttributesEntry_default_instance_.get_mutable()->set_default_instance(_TensorType_AttributesEntry_default_instance_.get_mutable());
  _TensorType_AttributesEntry_default_instance_.get_mutable()->InitAsDefaultInstance();
  _ListType_default_instance_.get_mutable()->type_ = const_cast< ::CoreML::Specification::MILSpec::ValueType*>(
      ::CoreML::Specification::MILSpec::ValueType::internal_default_instance());
  _ListType_default_instance_.get_mutable()->length_ = const_cast< ::CoreML::Specification::MILSpec::Dimension*>(
      ::CoreML::Specification::MILSpec::Dimension::internal_default_instance());
  _DictionaryType_default_instance_.get_mutable()->keytype_ = const_cast< ::CoreML::Specification::MILSpec::ValueType*>(
      ::CoreML::Specification::MILSpec::ValueType::internal_default_instance());
  _DictionaryType_default_instance_.get_mutable()->valuetype_ = const_cast< ::CoreML::Specification::MILSpec::ValueType*>(
      ::CoreML::Specification::MILSpec::ValueType::internal_default_instance());
  _Value_default_instance_.get_mutable()->type_ = const_cast< ::CoreML::Specification::MILSpec::ValueType*>(
      ::CoreML::Specification::MILSpec::ValueType::internal_default_instance());
  _DictionaryValue_KeyValuePair_default_instance_.get_mutable()->key_ = const_cast< ::CoreML::Specification::MILSpec::Value*>(
      ::CoreML::Specification::MILSpec::Value::internal_default_instance());
  _DictionaryValue_KeyValuePair_default_instance_.get_mutable()->value_ = const_cast< ::CoreML::Specification::MILSpec::Value*>(
      ::CoreML::Specification::MILSpec::Value::internal_default_instance());
}